

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int compute_valid_comp_types
              (MACROBLOCK *x,AV1_COMP *cpi,BLOCK_SIZE bsize,int masked_compound_used,
              int mode_search_mask,COMPOUND_TYPE *valid_comp_types)

{
  ushort uVar1;
  int iVar2;
  int in_ECX;
  long in_RSI;
  uint in_R8D;
  long in_R9;
  int try_distwtd_comp;
  int try_average_comp;
  int8_t enable_masked_type [2];
  int valid_check;
  int comp_type;
  int valid_type_count;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_ffffffffffffffa8;
  ushort in_stack_ffffffffffffffb0;
  BLOCK_SIZE in_stack_ffffffffffffffb2;
  uint in_stack_ffffffffffffffb3;
  bool bVar3;
  undefined1 uVar4;
  char local_3e [2];
  uint local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  uint local_1c;
  int local_18;
  long local_10;
  
  local_30 = in_RSI + 0x3bf80;
  local_34 = 0;
  local_28 = in_R9;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_10 = in_RSI;
  memset(local_3e,0,2);
  uVar1 = (ushort)local_1c;
  bVar3 = false;
  if (((local_1c & 2) != 0) && (bVar3 = false, *(int *)(*(long *)(local_30 + 0x6088) + 0x30) == 1))
  {
    bVar3 = *(char *)(local_10 + 0x60afc) != '\x02';
  }
  uVar4 = bVar3;
  for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
    in_stack_ffffffffffffffb0 = uVar1 & 1;
    if (local_38 != 0) {
      in_stack_ffffffffffffffb0 = (ushort)bVar3;
    }
    in_stack_ffffffffffffffb2 = BLOCK_4X4;
    in_stack_ffffffffffffffb3 = in_stack_ffffffffffffffb3 & 0xffffff00;
    local_3c = (uint)in_stack_ffffffffffffffb0;
    if ((local_3c != 0) && (iVar2 = is_interinter_compound_used('\0',BLOCK_4X4), iVar2 != 0)) {
      *(char *)(local_28 + local_34) = (char)local_38;
      local_34 = local_34 + 1;
    }
  }
  if (local_18 != 0) {
    local_3e[0] = enable_wedge_interinter_search
                            ((MACROBLOCK *)
                             CONCAT17(uVar4,CONCAT43(in_stack_ffffffffffffffb3,
                                                     CONCAT12(in_stack_ffffffffffffffb2,
                                                              in_stack_ffffffffffffffb0))),
                             in_stack_ffffffffffffffa8);
    local_3e[1] = *(byte *)(local_10 + 0x426fb) & 1;
    for (local_38 = 2; local_38 < 4; local_38 = local_38 + 1) {
      if ((((local_1c & 1 << ((byte)local_38 & 0x1f)) != 0) &&
          (iVar2 = is_interinter_compound_used
                             ((COMPOUND_TYPE)in_stack_ffffffffffffffb3,in_stack_ffffffffffffffb2),
          iVar2 != 0)) && (local_3e[local_38 + -2] != '\0')) {
        *(char *)(local_28 + local_34) = (char)local_38;
        local_34 = local_34 + 1;
      }
    }
  }
  return local_34;
}

Assistant:

static inline int compute_valid_comp_types(MACROBLOCK *x,
                                           const AV1_COMP *const cpi,
                                           BLOCK_SIZE bsize,
                                           int masked_compound_used,
                                           int mode_search_mask,
                                           COMPOUND_TYPE *valid_comp_types) {
  const AV1_COMMON *cm = &cpi->common;
  int valid_type_count = 0;
  int comp_type, valid_check;
  int8_t enable_masked_type[MASKED_COMPOUND_TYPES] = { 0, 0 };

  const int try_average_comp = (mode_search_mask & (1 << COMPOUND_AVERAGE));
  const int try_distwtd_comp =
      ((mode_search_mask & (1 << COMPOUND_DISTWTD)) &&
       cm->seq_params->order_hint_info.enable_dist_wtd_comp == 1 &&
       cpi->sf.inter_sf.use_dist_wtd_comp_flag != DIST_WTD_COMP_DISABLED);

  // Check if COMPOUND_AVERAGE and COMPOUND_DISTWTD are valid cases
  for (comp_type = COMPOUND_AVERAGE; comp_type <= COMPOUND_DISTWTD;
       comp_type++) {
    valid_check =
        (comp_type == COMPOUND_AVERAGE) ? try_average_comp : try_distwtd_comp;
    if (valid_check && is_interinter_compound_used(comp_type, bsize))
      valid_comp_types[valid_type_count++] = comp_type;
  }
  // Check if COMPOUND_WEDGE and COMPOUND_DIFFWTD are valid cases
  if (masked_compound_used) {
    // enable_masked_type[0] corresponds to COMPOUND_WEDGE
    // enable_masked_type[1] corresponds to COMPOUND_DIFFWTD
    enable_masked_type[0] = enable_wedge_interinter_search(x, cpi);
    enable_masked_type[1] = cpi->oxcf.comp_type_cfg.enable_diff_wtd_comp;
    for (comp_type = COMPOUND_WEDGE; comp_type <= COMPOUND_DIFFWTD;
         comp_type++) {
      if ((mode_search_mask & (1 << comp_type)) &&
          is_interinter_compound_used(comp_type, bsize) &&
          enable_masked_type[comp_type - COMPOUND_WEDGE])
        valid_comp_types[valid_type_count++] = comp_type;
    }
  }
  return valid_type_count;
}